

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi.c
# Opt level: O2

void opj_get_all_encoding_parameters
               (opj_image_t *p_image,opj_cp_t *p_cp,OPJ_UINT32 tileno,OPJ_INT32 *p_tx0,
               OPJ_INT32 *p_tx1,OPJ_INT32 *p_ty0,OPJ_INT32 *p_ty1,OPJ_UINT32 *p_dx_min,
               OPJ_UINT32 *p_dy_min,OPJ_UINT32 *p_max_prec,OPJ_UINT32 *p_max_res,
               OPJ_UINT32 **p_resolutions)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  OPJ_INT32 OVar4;
  OPJ_INT32 OVar5;
  OPJ_INT32 OVar6;
  OPJ_INT32 OVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  OPJ_UINT32 *pOVar14;
  int iVar15;
  OPJ_UINT32 OVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  opj_tccp_t *poVar22;
  opj_image_comp_t *local_80;
  
  uVar12 = p_cp->tw;
  if (tileno < p_cp->th * uVar12) {
    poVar22 = p_cp->tcps[tileno].tccps;
    local_80 = p_image->comps;
    uVar11 = (tileno % uVar12) * p_cp->tdx + p_cp->tx0;
    uVar3 = p_image->x0;
    if (p_image->x0 < uVar11) {
      uVar3 = uVar11;
    }
    *p_tx0 = uVar3;
    uVar3 = uVar11 + p_cp->tdx;
    if (CARRY4(uVar11,p_cp->tdx)) {
      uVar3 = 0xffffffff;
    }
    if (p_image->x1 <= uVar3) {
      uVar3 = p_image->x1;
    }
    *p_tx1 = uVar3;
    uVar3 = (tileno / uVar12) * p_cp->tdy + p_cp->ty0;
    uVar12 = p_image->y0;
    if (p_image->y0 < uVar3) {
      uVar12 = uVar3;
    }
    *p_ty0 = uVar12;
    uVar12 = uVar3 + p_cp->tdy;
    if (CARRY4(uVar3,p_cp->tdy)) {
      uVar12 = 0xffffffff;
    }
    if (p_image->y1 <= uVar12) {
      uVar12 = p_image->y1;
    }
    *p_ty1 = uVar12;
    *p_max_prec = 0;
    *p_max_res = 0;
    *p_dx_min = 0x7fffffff;
    *p_dy_min = 0x7fffffff;
    for (uVar13 = 0; uVar13 < p_image->numcomps; uVar13 = uVar13 + 1) {
      pOVar14 = p_resolutions[uVar13];
      OVar4 = opj_int_ceildiv(*p_tx0,local_80->dx);
      OVar5 = opj_int_ceildiv(*p_ty0,local_80->dy);
      OVar6 = opj_int_ceildiv(*p_tx1,local_80->dx);
      OVar7 = opj_int_ceildiv(*p_ty1,local_80->dy);
      uVar12 = poVar22->numresolutions;
      if (*p_max_res < uVar12) {
        *p_max_res = uVar12;
        uVar12 = poVar22->numresolutions;
      }
      uVar3 = uVar12;
      for (uVar18 = 0; uVar3 = uVar3 - 1, uVar18 < uVar12; uVar18 = uVar18 + 1) {
        OVar1 = poVar22->prcw[uVar18];
        OVar2 = poVar22->prch[uVar18];
        *pOVar14 = OVar1;
        pOVar14[1] = OVar2;
        if (uVar3 + OVar1 < 0x20) {
          bVar8 = (byte)(uVar3 + OVar1);
          if (local_80->dx <= 0xffffffffU >> (bVar8 & 0x1f)) {
            OVar16 = local_80->dx << (bVar8 & 0x1f);
            if ((int)*p_dx_min < (int)OVar16) {
              OVar16 = *p_dx_min;
            }
            *p_dx_min = OVar16;
          }
        }
        if (uVar3 + OVar2 < 0x20) {
          bVar8 = (byte)(uVar3 + OVar2);
          if (local_80->dy <= 0xffffffffU >> (bVar8 & 0x1f)) {
            OVar16 = local_80->dy << (bVar8 & 0x1f);
            if ((int)*p_dy_min < (int)OVar16) {
              OVar16 = *p_dy_min;
            }
            *p_dy_min = OVar16;
          }
        }
        bVar8 = (byte)uVar3;
        uVar21 = ~(-1L << (bVar8 & 0x3f));
        iVar19 = (int)((long)((long)OVar4 + uVar21) >> (bVar8 & 0x3f));
        bVar9 = (byte)OVar1;
        iVar15 = (int)((long)((long)OVar5 + uVar21) >> (bVar8 & 0x3f));
        bVar10 = (byte)OVar2;
        iVar17 = (int)((long)((long)OVar6 + uVar21) >> (bVar8 & 0x3f));
        iVar20 = (int)((long)(uVar21 + (long)OVar7) >> (bVar8 & 0x3f));
        OVar1 = ((int)((1L << (bVar9 & 0x3f)) + (long)iVar17 + -1 >> (bVar9 & 0x3f)) -
                 (iVar19 >> (bVar9 & 0x1f)) << (bVar9 & 0x1f)) >> (bVar9 & 0x1f);
        if (iVar19 == iVar17) {
          OVar1 = 0;
        }
        OVar2 = ((int)((1L << (bVar10 & 0x3f)) + (long)iVar20 + -1 >> (bVar10 & 0x3f)) -
                 (iVar15 >> (bVar10 & 0x1f)) << (bVar10 & 0x1f)) >> (bVar10 & 0x1f);
        if (iVar15 == iVar20) {
          OVar2 = 0;
        }
        pOVar14[2] = OVar1;
        pOVar14[3] = OVar2;
        if (*p_max_prec < OVar2 * OVar1) {
          *p_max_prec = OVar2 * OVar1;
        }
        uVar12 = poVar22->numresolutions;
        pOVar14 = pOVar14 + 4;
      }
      poVar22 = poVar22 + 1;
      local_80 = local_80 + 1;
    }
    return;
  }
  __assert_fail("tileno < p_cp->tw * p_cp->th",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/pi.c"
                ,0x373,
                "void opj_get_all_encoding_parameters(const opj_image_t *, const opj_cp_t *, OPJ_UINT32, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_INT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 *, OPJ_UINT32 **)"
               );
}

Assistant:

static void opj_get_all_encoding_parameters(const opj_image_t *p_image,
        const opj_cp_t *p_cp,
        OPJ_UINT32 tileno,
        OPJ_INT32 * p_tx0,
        OPJ_INT32 * p_tx1,
        OPJ_INT32 * p_ty0,
        OPJ_INT32 * p_ty1,
        OPJ_UINT32 * p_dx_min,
        OPJ_UINT32 * p_dy_min,
        OPJ_UINT32 * p_max_prec,
        OPJ_UINT32 * p_max_res,
        OPJ_UINT32 ** p_resolutions)
{
    /* loop*/
    OPJ_UINT32 compno, resno;

    /* pointers*/
    const opj_tcp_t *tcp = 00;
    const opj_tccp_t * l_tccp = 00;
    const opj_image_comp_t * l_img_comp = 00;

    /* to store l_dx, l_dy, w and h for each resolution and component.*/
    OPJ_UINT32 * lResolutionPtr;

    /* position in x and y of tile*/
    OPJ_UINT32 p, q;

    /* non-corrected (in regard to image offset) tile offset */
    OPJ_UINT32 l_tx0, l_ty0;

    /* preconditions in debug*/
    assert(p_cp != 00);
    assert(p_image != 00);
    assert(tileno < p_cp->tw * p_cp->th);

    /* initializations*/
    tcp = &p_cp->tcps [tileno];
    l_tccp = tcp->tccps;
    l_img_comp = p_image->comps;

    /* position in x and y of tile*/
    p = tileno % p_cp->tw;
    q = tileno / p_cp->tw;

    /* here calculation of tx0, tx1, ty0, ty1, maxprec, l_dx and l_dy */
    l_tx0 = p_cp->tx0 + p *
            p_cp->tdx; /* can't be greater than p_image->x1 so won't overflow */
    *p_tx0 = (OPJ_INT32)opj_uint_max(l_tx0, p_image->x0);
    *p_tx1 = (OPJ_INT32)opj_uint_min(opj_uint_adds(l_tx0, p_cp->tdx), p_image->x1);
    l_ty0 = p_cp->ty0 + q *
            p_cp->tdy; /* can't be greater than p_image->y1 so won't overflow */
    *p_ty0 = (OPJ_INT32)opj_uint_max(l_ty0, p_image->y0);
    *p_ty1 = (OPJ_INT32)opj_uint_min(opj_uint_adds(l_ty0, p_cp->tdy), p_image->y1);

    /* max precision and resolution is 0 (can only grow)*/
    *p_max_prec = 0;
    *p_max_res = 0;

    /* take the largest value for dx_min and dy_min*/
    *p_dx_min = 0x7fffffff;
    *p_dy_min = 0x7fffffff;

    for (compno = 0; compno < p_image->numcomps; ++compno) {
        /* aritmetic variables to calculate*/
        OPJ_UINT32 l_level_no;
        OPJ_INT32 l_rx0, l_ry0, l_rx1, l_ry1;
        OPJ_INT32 l_px0, l_py0, l_px1, py1;
        OPJ_UINT32 l_product;
        OPJ_INT32 l_tcx0, l_tcy0, l_tcx1, l_tcy1;
        OPJ_UINT32 l_pdx, l_pdy, l_pw, l_ph;

        lResolutionPtr = p_resolutions[compno];

        l_tcx0 = opj_int_ceildiv(*p_tx0, (OPJ_INT32)l_img_comp->dx);
        l_tcy0 = opj_int_ceildiv(*p_ty0, (OPJ_INT32)l_img_comp->dy);
        l_tcx1 = opj_int_ceildiv(*p_tx1, (OPJ_INT32)l_img_comp->dx);
        l_tcy1 = opj_int_ceildiv(*p_ty1, (OPJ_INT32)l_img_comp->dy);

        if (l_tccp->numresolutions > *p_max_res) {
            *p_max_res = l_tccp->numresolutions;
        }

        /* use custom size for precincts*/
        l_level_no = l_tccp->numresolutions;
        for (resno = 0; resno < l_tccp->numresolutions; ++resno) {
            OPJ_UINT32 l_dx, l_dy;

            --l_level_no;

            /* precinct width and height*/
            l_pdx = l_tccp->prcw[resno];
            l_pdy = l_tccp->prch[resno];
            *lResolutionPtr++ = l_pdx;
            *lResolutionPtr++ = l_pdy;
            if (l_pdx + l_level_no < 32 &&
                    l_img_comp->dx <= UINT_MAX / (1u << (l_pdx + l_level_no))) {
                l_dx = l_img_comp->dx * (1u << (l_pdx + l_level_no));
                /* take the minimum size for l_dx for each comp and resolution*/
                *p_dx_min = (OPJ_UINT32)opj_int_min((OPJ_INT32) * p_dx_min, (OPJ_INT32)l_dx);
            }
            if (l_pdy + l_level_no < 32 &&
                    l_img_comp->dy <= UINT_MAX / (1u << (l_pdy + l_level_no))) {
                l_dy = l_img_comp->dy * (1u << (l_pdy + l_level_no));
                *p_dy_min = (OPJ_UINT32)opj_int_min((OPJ_INT32) * p_dy_min, (OPJ_INT32)l_dy);
            }

            /* various calculations of extents*/
            l_rx0 = opj_int_ceildivpow2(l_tcx0, (OPJ_INT32)l_level_no);
            l_ry0 = opj_int_ceildivpow2(l_tcy0, (OPJ_INT32)l_level_no);
            l_rx1 = opj_int_ceildivpow2(l_tcx1, (OPJ_INT32)l_level_no);
            l_ry1 = opj_int_ceildivpow2(l_tcy1, (OPJ_INT32)l_level_no);
            l_px0 = opj_int_floordivpow2(l_rx0, (OPJ_INT32)l_pdx) << l_pdx;
            l_py0 = opj_int_floordivpow2(l_ry0, (OPJ_INT32)l_pdy) << l_pdy;
            l_px1 = opj_int_ceildivpow2(l_rx1, (OPJ_INT32)l_pdx) << l_pdx;
            py1 = opj_int_ceildivpow2(l_ry1, (OPJ_INT32)l_pdy) << l_pdy;
            l_pw = (l_rx0 == l_rx1) ? 0 : (OPJ_UINT32)((l_px1 - l_px0) >> l_pdx);
            l_ph = (l_ry0 == l_ry1) ? 0 : (OPJ_UINT32)((py1 - l_py0) >> l_pdy);
            *lResolutionPtr++ = l_pw;
            *lResolutionPtr++ = l_ph;
            l_product = l_pw * l_ph;

            /* update precision*/
            if (l_product > *p_max_prec) {
                *p_max_prec = l_product;
            }

        }
        ++l_tccp;
        ++l_img_comp;
    }
}